

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

rcode __thiscall olc::Sprite::LoadFromPGESprFile(Sprite *this,string *sImageFile,ResourcePack *pack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  Pixel *pPVar5;
  ulong uVar6;
  long lVar7;
  rcode rVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  ResourceBuffer rb;
  istream is;
  undefined1 local_288 [64];
  pointer local_248;
  pointer local_238;
  long local_230 [2];
  ios_base local_220 [504];
  
  if (this->pColData != (Pixel *)0x0) {
    operator_delete__(this->pColData);
  }
  if (pack == (ResourcePack *)0x0) {
    std::ifstream::ifstream((string *)local_230);
    std::ifstream::open((string *)local_230,(_Ios_Openmode)sImageFile);
    cVar4 = std::__basic_file<char>::is_open();
    rVar8 = FAIL;
    if (cVar4 != '\0') {
      std::istream::read((char *)local_230,(long)this);
      std::istream::read((char *)local_230,(long)&this->height);
      lVar9 = (long)this->height * (long)this->width;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)lVar9) {
        uVar6 = lVar9 * 4;
      }
      pPVar5 = (Pixel *)operator_new__(uVar6);
      auVar3 = _DAT_00128060;
      auVar2 = _DAT_00128050;
      auVar1 = _DAT_00128040;
      if ((int)lVar9 != 0) {
        uVar6 = lVar9 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
        auVar14._8_4_ = (int)uVar6;
        auVar14._0_8_ = uVar6;
        auVar14._12_4_ = (int)(uVar6 >> 0x20);
        lVar7 = 0;
        auVar14 = auVar14 ^ _DAT_00128060;
        do {
          auVar13._8_4_ = (int)lVar7;
          auVar13._0_8_ = lVar7;
          auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar10 = (auVar13 | auVar2) ^ auVar3;
          iVar11 = auVar14._4_4_;
          if ((bool)(~(auVar10._4_4_ == iVar11 && auVar14._0_4_ < auVar10._0_4_ ||
                      iVar11 < auVar10._4_4_) & 1)) {
            pPVar5[lVar7].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
          }
          if ((auVar10._12_4_ != auVar14._12_4_ || auVar10._8_4_ <= auVar14._8_4_) &&
              auVar10._12_4_ <= auVar14._12_4_) {
            pPVar5[lVar7 + 1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
          }
          auVar13 = (auVar13 | auVar1) ^ auVar3;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar13._0_4_ <= auVar14._0_4_)) {
            pPVar5[lVar7 + 2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
            pPVar5[lVar7 + 3].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
          }
          lVar7 = lVar7 + 4;
        } while ((uVar6 - ((uint)(lVar9 + 0x3fffffffffffffffU) & 3)) + 4 != lVar7);
      }
      this->pColData = pPVar5;
      rVar8 = OK;
      std::istream::read((char *)local_230,(long)pPVar5);
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    ResourcePack::GetFileBuffer((ResourceBuffer *)local_288,pack,sImageFile);
    std::istream::istream((istream *)local_230,(streambuf *)local_288);
    std::istream::read((char *)local_230,(long)this);
    std::istream::read((char *)local_230,(long)&this->height);
    lVar9 = (long)this->height * (long)this->width;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)lVar9) {
      uVar6 = lVar9 * 4;
    }
    pPVar5 = (Pixel *)operator_new__(uVar6);
    auVar3 = _DAT_00128060;
    auVar2 = _DAT_00128050;
    auVar1 = _DAT_00128040;
    if ((int)lVar9 != 0) {
      uVar6 = lVar9 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
      auVar10._8_4_ = (int)uVar6;
      auVar10._0_8_ = uVar6;
      auVar10._12_4_ = (int)(uVar6 >> 0x20);
      lVar7 = 0;
      auVar10 = auVar10 ^ _DAT_00128060;
      do {
        auVar12._8_4_ = (int)lVar7;
        auVar12._0_8_ = lVar7;
        auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar14 = (auVar12 | auVar2) ^ auVar3;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                    iVar11 < auVar14._4_4_) & 1)) {
          pPVar5[lVar7].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        }
        if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
            auVar14._12_4_ <= auVar10._12_4_) {
          pPVar5[lVar7 + 1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        }
        auVar14 = (auVar12 | auVar1) ^ auVar3;
        iVar15 = auVar14._4_4_;
        if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
          pPVar5[lVar7 + 2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
          pPVar5[lVar7 + 3].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        }
        lVar7 = lVar7 + 4;
      } while ((uVar6 - ((uint)(lVar9 + 0x3fffffffffffffffU) & 3)) + 4 != lVar7);
    }
    this->pColData = pPVar5;
    std::istream::read((char *)local_230,(long)pPVar5);
    local_230[0] = _VTT;
    *(undefined8 *)((long)local_230 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
    local_230[1] = 0;
    std::ios_base::~ios_base(local_220);
    local_288._0_8_ = &PTR__ResourceBuffer_00130970;
    if (local_248 != (pointer)0x0) {
      operator_delete(local_248,(long)local_238 - (long)local_248);
    }
    local_288._0_8_ = png_get_image_width;
    std::locale::~locale((locale *)(local_288 + 0x38));
    rVar8 = OK;
  }
  return rVar8;
}

Assistant:

olc::rcode Sprite::LoadFromPGESprFile(const std::string &sImageFile, olc::ResourcePack *pack)
	{
		if (pColData)
			delete[] pColData;
		auto ReadData = [&](std::istream &is) {
			is.read((char *)&width, sizeof(int32_t));
			is.read((char *)&height, sizeof(int32_t));
			pColData = new Pixel[width * height];
			is.read((char *)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
		};

		// These are essentially Memory Surfaces represented by olc::Sprite
		// which load very fast, but are completely uncompressed
		if (pack == nullptr)
		{
			std::ifstream ifs;
			ifs.open(sImageFile, std::ifstream::binary);
			if (ifs.is_open())
			{
				ReadData(ifs);
				return olc::OK;
			}
			else
				return olc::FAIL;
		}
		else
		{
			ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
			std::istream is(&rb);
			ReadData(is);
			return olc::OK;
		}
		return olc::FAIL;
	}